

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O1

void __thiscall
syntax_gtest_tests::iu_SyntaxTest_x_iutest_x_LongDouble_Test::Body
          (iu_SyntaxTest_x_iutest_x_LongDouble_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  AssertionResult iutest_ar;
  allocator<char> local_201;
  AssertionResult local_200;
  AssertionHelper local_1d8;
  undefined1 local_1a0 [392];
  
  iutest::internal::CmpHelperFloatingPointEQ<long_double>
            (&local_200,"1.0l","d",(longdouble)1,(longdouble)1);
  bVar2 = local_200.m_result;
  if (local_200.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    local_1d8.m_part_result.super_iuCodeMessage.m_message._0_10_ = (BADTYPE)1;
    iutest::detail::iuStreamMessage::operator<<
              ((iuStreamMessage *)local_1a0,(longdouble *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_201);
    local_1d8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
    ;
    local_1d8.m_part_result.super_iuCodeMessage.m_line = 0xd4;
    local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    iutest::internal::CmpHelperFloatingPointEQ<long_double>
              (&local_200,"1.0l","d",(longdouble)1,(longdouble)1);
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      local_1d8.m_part_result.super_iuCodeMessage.m_message._0_10_ = (BADTYPE)1;
      iutest::detail::iuStreamMessage::operator<<
                ((iuStreamMessage *)local_1a0,(longdouble *)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_201);
      local_1d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_1d8.m_part_result.super_iuCodeMessage.m_line = 0xd6;
      local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    paVar1 = &local_200.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperFloatingPointEQ<long_double>
              (&local_200,"1.0l","d",(longdouble)1,(longdouble)1);
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      local_1d8.m_part_result.super_iuCodeMessage.m_message._0_10_ = (BADTYPE)1;
      iutest::detail::iuStreamMessage::operator<<
                ((iuStreamMessage *)local_1a0,(longdouble *)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_201);
      local_1d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_1d8.m_part_result.super_iuCodeMessage.m_line = 0xd8;
      local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperFloatingPointEQ<long_double>
              (&local_200,"1.0l","d",(longdouble)1,(longdouble)1);
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      local_1d8.m_part_result.super_iuCodeMessage.m_message._0_10_ = (BADTYPE)1;
      iutest::detail::iuStreamMessage::operator<<
                ((iuStreamMessage *)local_1a0,(longdouble *)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_201);
      local_1d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_1d8.m_part_result.super_iuCodeMessage.m_line = 0xda;
      local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

TEST(SyntaxTest, LongDouble)
{
    if( long double d = 1.0l )
        ASSERT_LONG_DOUBLE_EQ(1.0l, d) << d;
    if( long double d = 1.0l )
        EXPECT_LONG_DOUBLE_EQ(1.0l, d) << d;
    if( long double d = 1.0l )
        INFORM_LONG_DOUBLE_EQ(1.0l, d) << d;
    if( long double d = 1.0l )
        ASSUME_LONG_DOUBLE_EQ(1.0l, d) << d;
}